

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEngine::setFileTime(QFSFileEngine *this,QDateTime *newDate,FileTime time)

{
  bool bVar1;
  QFSFileEnginePrivate *this_00;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  QSystemError error;
  undefined4 in_stack_ffffffffffffff78;
  MetaDataFlag in_stack_ffffffffffffff7c;
  QFSFileEnginePrivate *in_stack_ffffffffffffff80;
  QFileSystemMetaData *this_01;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  int in_stack_ffffffffffffff98;
  bool local_4d;
  QSystemError local_30 [4];
  Int local_c;
  long local_8;
  
  flags.i = (Int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFSFileEngine *)0x172909);
  local_c = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
            super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  bVar1 = ::operator==((QFlags<QIODeviceBase::OpenModeFlag>)flags.i,
                       (OpenModeFlag)in_stack_ffffffffffffff80);
  if (bVar1) {
    qt_error_string(flags.i);
    QAbstractFileEngine::setError
              ((QAbstractFileEngine *)this_00,flags.i,(QString *)in_stack_ffffffffffffff80);
    QString::~QString((QString *)0x172958);
    local_4d = false;
  }
  else {
    local_30[0].errorCode = -0x55555556;
    local_30[0].errorScope = 0xaaaaaaaa;
    QSystemError::QSystemError(local_30);
    QFSFileEnginePrivate::nativeHandle(in_stack_ffffffffffffff80);
    bVar1 = QFileSystemEngine::setFileTime
                      (in_stack_ffffffffffffff98,(QDateTime *)this_00,flags.i,
                       (QSystemError *)in_stack_ffffffffffffff80);
    if (bVar1) {
      this_01 = &this_00->metaData;
      QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
                (&this_01->knownFlagsMask,in_stack_ffffffffffffff7c);
      QFileSystemMetaData::clearFlags(this_01,(MetaDataFlags)flags.i);
      local_4d = true;
    }
    else {
      QSystemError::toString
                ((QSystemError *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      QAbstractFileEngine::setError
                ((QAbstractFileEngine *)this_00,flags.i,(QString *)in_stack_ffffffffffffff80);
      QString::~QString((QString *)0x1729c8);
      local_4d = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4d;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setFileTime(const QDateTime &newDate, QFile::FileTime time)
{
    Q_D(QFSFileEngine);

    if (d->openMode == QIODevice::NotOpen) {
        setError(QFile::PermissionsError, qt_error_string(EACCES));
        return false;
    }

    QSystemError error;
    if (!QFileSystemEngine::setFileTime(d->nativeHandle(), newDate, time, error)) {
        setError(QFile::PermissionsError, error.toString());
        return false;
    }

    d->metaData.clearFlags(QFileSystemMetaData::Times);
    return true;
}